

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O1

optional_ptr<duckdb::AttachedDatabase,_true> __thiscall
duckdb::DatabaseManager::GetDatabase(DatabaseManager *this,ClientContext *context,string *name)

{
  int iVar1;
  pointer this_00;
  _Head_base<0UL,_duckdb::AttachedDatabase_*,_false> _Var2;
  pointer pCVar3;
  string local_50;
  
  StringUtil::Lower(&local_50,name);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (iVar1 == 0) {
    pCVar3 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
             operator->(&context->client_data);
    _Var2._M_head_impl =
         (pCVar3->temporary_objects).internal.
         super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    StringUtil::Lower(&local_50,name);
    iVar1 = ::std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (iVar1 == 0) {
      _Var2._M_head_impl =
           (this->system).
           super_unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_>
           .super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl;
    }
    else {
      this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
                operator->(&this->databases);
      _Var2._M_head_impl = (AttachedDatabase *)CatalogSet::GetEntry(this_00,context,name);
    }
  }
  return (optional_ptr<duckdb::AttachedDatabase,_true>)_Var2._M_head_impl;
}

Assistant:

optional_ptr<AttachedDatabase> DatabaseManager::GetDatabase(ClientContext &context, const string &name) {
	if (StringUtil::Lower(name) == TEMP_CATALOG) {
		return context.client_data->temporary_objects.get();
	}
	if (StringUtil::Lower(name) == SYSTEM_CATALOG) {
		return system;
	}
	return reinterpret_cast<AttachedDatabase *>(databases->GetEntry(context, name).get());
}